

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

ecs_time_t ecs_time_sub(ecs_time_t t1,ecs_time_t t2)

{
  uint uVar1;
  ecs_time_t eVar2;
  uint32_t uVar3;
  bool bVar4;
  
  bVar4 = (ulong)t1 >> 0x20 < (ulong)t2 >> 0x20;
  uVar1 = -t2.sec;
  if (bVar4) {
    uVar1 = ~t2.sec;
  }
  uVar3 = t1.nanosec + 1000000000;
  if (!bVar4) {
    uVar3 = t1.nanosec;
  }
  eVar2.sec = uVar1 + t1.sec;
  eVar2.nanosec = uVar3 - t2.nanosec;
  return eVar2;
}

Assistant:

ecs_time_t ecs_time_sub(
    ecs_time_t t1,
    ecs_time_t t2)
{
    ecs_time_t result;

    if (t1.nanosec >= t2.nanosec) {
        result.nanosec = t1.nanosec - t2.nanosec;
        result.sec = t1.sec - t2.sec;
    } else {
        result.nanosec = t1.nanosec - t2.nanosec + 1000000000;
        result.sec = t1.sec - t2.sec - 1;
    }

    return result;
}